

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextIO.cpp
# Opt level: O0

void CreateMsgWindow(float fTimeToDisplay,int numSee,int numShow,int bufTime)

{
  bool bVar1;
  reference pvVar2;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  uint in_XMM0_Da;
  char aszMsgTxt [500];
  unique_lock<std::recursive_mutex> lock;
  mutex_type *in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  undefined5 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdae;
  byte bVar3;
  byte bVar4;
  float *in_stack_fffffffffffffdb8;
  list<dispTextTy,_std::allocator<dispTextTy>_> *in_stack_fffffffffffffdc0;
  string local_40 [48];
  uint local_10;
  uint local_c;
  uint local_8;
  uint local_4;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_EDI;
  local_4 = in_XMM0_Da;
  std::unique_lock<std::recursive_mutex>::unique_lock
            ((unique_lock<std::recursive_mutex> *)in_stack_fffffffffffffda0,
             in_stack_fffffffffffffd98);
  bVar1 = std::__cxx11::list<dispTextTy,_std::allocator<dispTextTy>_>::empty(&listTexts_abi_cxx11_);
  bVar3 = 0;
  bVar4 = bVar3;
  if (!bVar1) {
    pvVar2 = std::__cxx11::list<dispTextTy,_std::allocator<dispTextTy>_>::front
                       ((list<dispTextTy,_std::allocator<dispTextTy>_> *)in_stack_fffffffffffffda0);
    std::__cxx11::string::substr((ulong)local_40,(ulong)&pvVar2->text);
    bVar3 = std::operator==(in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98);
    in_stack_fffffffffffffdae = bVar3;
    bVar4 = bVar3;
    std::__cxx11::string::~string(local_40);
  }
  if ((bVar3 & 1) != 0) {
    std::__cxx11::list<dispTextTy,_std::allocator<dispTextTy>_>::pop_front
              ((list<dispTextTy,_std::allocator<dispTextTy>_> *)in_stack_fffffffffffffda0);
  }
  if (-1 < (int)local_10) {
    in_stack_fffffffffffffda0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &stack0xfffffffffffffdb8;
    snprintf((char *)in_stack_fffffffffffffda0,500,
             "Filling buffer: seeing %d aircraft, displaying %d, still %ds to buffer",(ulong)local_8
             ,(ulong)local_c,(ulong)local_10);
    std::__cxx11::list<dispTextTy,std::allocator<dispTextTy>>::
    emplace_front<float,logLevelTy,char(&)[500]>
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               (logLevelTy *)CONCAT44(local_4 ^ 0x80000000,1),
               (char (*) [500])
               CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffdae,
                                       CONCAT15(bVar3,in_stack_fffffffffffffda8))));
  }
  WndMsg::DoShow();
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)in_stack_fffffffffffffda0);
  return;
}

Assistant:

void CreateMsgWindow(float fTimeToDisplay, int numSee, int numShow, int bufTime)
{
    // This entry shall always be the first one in the list
    // So let's see if it is already the first one, then we'd remove it first
    std::unique_lock<std::recursive_mutex> lock(gListMutex);
    if (!listTexts.empty() && listTexts.front().text.substr(0,23) == MSG_BUF_FILL_BEGIN)
        listTexts.pop_front();
    
    // Now create the actual message if there is anything to show
    if (bufTime >= 0) {
        char aszMsgTxt[500];
        snprintf(aszMsgTxt, sizeof(aszMsgTxt), MSG_BUF_FILL_COUNTDOWN,
                 numSee, numShow, bufTime);
        // add to list of display texts _at front_
        listTexts.emplace_front(-fTimeToDisplay, logINFO, aszMsgTxt);
    }
    
    // Show the window
    WndMsg::DoShow();
}